

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::Expected(DataParser *this,String *expected_symbols)

{
  undefined8 uVar1;
  String local_70;
  String local_40;
  char local_19;
  String *pSStack_18;
  char c;
  String *expected_symbols_local;
  DataParser *this_local;
  
  pSStack_18 = expected_symbols;
  expected_symbols_local = &this->expression;
  local_19 = Look(this);
  if (local_19 == '\0') {
    uVar1 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_(&local_40,"Expected %s but found end of string.",uVar1);
    Error(this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    uVar1 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_
              (&local_70,"Expected %s but found character \'%c\'.",uVar1,(ulong)(uint)(int)local_19)
    ;
    Error(this,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Expected(const String& expected_symbols)
	{
		const char c = Look();
		if (c == '\0')
			Error(CreateString("Expected %s but found end of string.", expected_symbols.c_str()));
		else
			Error(CreateString("Expected %s but found character '%c'.", expected_symbols.c_str(), c));
	}